

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkroom.c
# Opt level: O0

mkroom * pick_room(level *lev,boolean strict)

{
  boolean bVar1;
  int iVar2;
  int local_2c;
  mkroom *pmStack_28;
  int i;
  mkroom *sroom;
  boolean strict_local;
  level *lev_local;
  
  local_2c = lev->nroom;
  iVar2 = rn2(lev->nroom);
  pmStack_28 = lev->rooms + iVar2;
  do {
    if (local_2c == 0) {
      return (mkroom *)0x0;
    }
    if (pmStack_28 == lev->rooms + lev->nroom) {
      pmStack_28 = lev->rooms;
    }
    if (pmStack_28->hx < '\0') {
      return (mkroom *)0x0;
    }
    if (pmStack_28->rtype == '\0') {
      if (strict == '\0') {
        bVar1 = has_upstairs(lev,pmStack_28);
        if ((bVar1 == '\0') &&
           ((bVar1 = has_dnstairs(lev,pmStack_28), bVar1 == '\0' || (iVar2 = rn2(3), iVar2 == 0))))
        {
LAB_002421bb:
          if ((pmStack_28->doorct == '\x01') ||
             ((iVar2 = rn2(5), iVar2 == 0 || (flags.debug != '\0')))) {
            return pmStack_28;
          }
        }
      }
      else {
        bVar1 = has_upstairs(lev,pmStack_28);
        if ((bVar1 == '\0') && (bVar1 = has_dnstairs(lev,pmStack_28), bVar1 == '\0'))
        goto LAB_002421bb;
      }
    }
    pmStack_28 = pmStack_28 + 1;
    local_2c = local_2c + -1;
  } while( true );
}

Assistant:

struct mkroom *pick_room(struct level *lev, boolean strict)
{
	struct mkroom *sroom;
	int i = lev->nroom;

	for (sroom = &lev->rooms[rn2(lev->nroom)]; i--; sroom++) {
		if (sroom == &lev->rooms[lev->nroom])
			sroom = &lev->rooms[0];
		if (sroom->hx < 0)
			return NULL;
		if (sroom->rtype != OROOM)	continue;
		if (!strict) {
		    if (has_upstairs(lev, sroom) || (has_dnstairs(lev, sroom) && rn2(3)))
			continue;
		} else if (has_upstairs(lev, sroom) || has_dnstairs(lev, sroom))
			continue;
		if (sroom->doorct == 1 || !rn2(5) || wizard)
			return sroom;
	}
	return NULL;
}